

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_entry.hxx
# Opt level: O0

ptr<log_entry> nuraft::log_entry::deserialize(buffer *buf)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  buffer *in_RSI;
  element_type *in_RDI;
  ptr<log_entry> pVar1;
  ptr<buffer> data;
  log_val_type t;
  ulong term;
  element_type *args_1;
  EVP_PKEY_CTX *dst;
  buffer *in_stack_ffffffffffffffd0;
  
  args_1 = in_RDI;
  nuraft::buffer::get_ulong(in_RSI);
  nuraft::buffer::get_byte(in_stack_ffffffffffffffd0);
  dst = (EVP_PKEY_CTX *)&stack0xffffffffffffffd0;
  nuraft::buffer::copy(dst,(EVP_PKEY_CTX *)in_RSI);
  cs_new<nuraft::log_entry,unsigned_long&,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type&>
            ((unsigned_long *)dst,(shared_ptr<nuraft::buffer> *)args_1,(log_val_type *)in_RDI);
  std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x199dd0);
  pVar1.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<log_entry>)pVar1.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static ptr<log_entry> deserialize(buffer& buf) {
        ulong term = buf.get_ulong();
        log_val_type t = static_cast<log_val_type>(buf.get_byte());
        ptr<buffer> data = buffer::copy(buf);
        return cs_new<log_entry>(term, data, t);
    }